

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

void __thiscall
pbrt::PiecewiseConstant1D::PiecewiseConstant1D
          (PiecewiseConstant1D *this,span<const_float> f,Float min,Float max,Allocator alloc)

{
  float **ppfVar1;
  float fVar2;
  float *pfVar3;
  float *pfVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined8 uVar20;
  undefined8 uVar21;
  byte bVar22;
  byte bVar23;
  ulong uVar24;
  size_t sVar25;
  long lVar26;
  size_t sVar27;
  ulong uVar28;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *__range2;
  ushort uVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 in_ZMM8 [64];
  Float vb;
  Float local_40;
  Float local_3c;
  Float va;
  undefined4 uStack_34;
  
  auVar41 = in_ZMM8._0_16_;
  sVar25 = f.n;
  local_40 = min;
  local_3c = max;
  _va = alloc.memoryResource;
  pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>::vector<float_const*>
            ((vector<float,pstd::pmr::polymorphic_allocator<float>> *)this,f.ptr,f.ptr + sVar25,
             (polymorphic_allocator<float> *)&va);
  uVar28 = sVar25 + 1;
  (this->cdf).alloc.memoryResource = alloc.memoryResource;
  (this->cdf).ptr = (float *)0x0;
  (this->cdf).nAlloc = 0;
  (this->cdf).nStored = 0;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(&this->cdf,uVar28);
  ppfVar1 = &(this->cdf).ptr;
  if (uVar28 != 0) {
    memset(*ppfVar1,0,uVar28 * 4);
  }
  (this->cdf).nStored = uVar28;
  this->min = local_40;
  this->max = local_3c;
  this->funcInt = 0.0;
  va = local_3c;
  vb = local_40;
  if (local_3c <= local_40) {
    LogFatal<char_const(&)[4],char_const(&)[4],char_const(&)[4],float&,char_const(&)[4],float&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.h"
               ,0x29f,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [4])0x3fe624,
               (char (*) [4])0x3fe616,(char (*) [4])0x3fe624,(float *)&va,(char (*) [4])0x3fe616,&vb
              );
  }
  pfVar3 = (this->func).ptr;
  sVar27 = (this->func).nStored;
  if (sVar27 != 0) {
    uVar24 = sVar27 + 0x3fffffffffffffff;
    auVar32 = vpbroadcastq_avx512f();
    lVar26 = 0;
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar35 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
    do {
      auVar36 = vpbroadcastq_avx512f();
      auVar37 = vporq_avx512f(auVar36,auVar33);
      auVar36 = vporq_avx512f(auVar36,auVar34);
      uVar20 = vpcmpuq_avx512f(auVar36,auVar32,2);
      bVar22 = (byte)uVar20;
      uVar20 = vpcmpuq_avx512f(auVar37,auVar32,2);
      bVar23 = (byte)uVar20;
      uVar29 = CONCAT11(bVar23,bVar22);
      pfVar4 = pfVar3 + lVar26;
      auVar36._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * (int)pfVar4[1];
      auVar36._0_4_ = (uint)(bVar22 & 1) * (int)*pfVar4;
      auVar36._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * (int)pfVar4[2];
      auVar36._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * (int)pfVar4[3];
      auVar36._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * (int)pfVar4[4];
      auVar36._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * (int)pfVar4[5];
      auVar36._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * (int)pfVar4[6];
      auVar36._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * (int)pfVar4[7];
      auVar36._32_4_ = (uint)(bVar23 & 1) * (int)pfVar4[8];
      auVar36._36_4_ = (uint)(bVar23 >> 1 & 1) * (int)pfVar4[9];
      auVar36._40_4_ = (uint)(bVar23 >> 2 & 1) * (int)pfVar4[10];
      auVar36._44_4_ = (uint)(bVar23 >> 3 & 1) * (int)pfVar4[0xb];
      auVar36._48_4_ = (uint)(bVar23 >> 4 & 1) * (int)pfVar4[0xc];
      auVar36._52_4_ = (uint)(bVar23 >> 5 & 1) * (int)pfVar4[0xd];
      auVar36._56_4_ = (uint)(bVar23 >> 6 & 1) * (int)pfVar4[0xe];
      auVar36._60_4_ = (uint)(bVar23 >> 7) * (int)pfVar4[0xf];
      auVar36 = vandps_avx512dq(auVar36,auVar35);
      pfVar4 = pfVar3 + lVar26;
      bVar5 = (bool)((byte)(uVar29 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar29 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar29 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar29 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar29 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar29 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar29 >> 7) & 1);
      bVar12 = (bool)(bVar23 >> 1 & 1);
      bVar13 = (bool)(bVar23 >> 2 & 1);
      bVar14 = (bool)(bVar23 >> 3 & 1);
      bVar15 = (bool)(bVar23 >> 4 & 1);
      bVar16 = (bool)(bVar23 >> 5 & 1);
      bVar17 = (bool)(bVar23 >> 6 & 1);
      *pfVar4 = (float)((uint)(bVar22 & 1) * auVar36._0_4_ |
                       (uint)!(bool)(bVar22 & 1) * (int)*pfVar4);
      pfVar4[1] = (float)((uint)bVar5 * auVar36._4_4_ | (uint)!bVar5 * (int)pfVar4[1]);
      pfVar4[2] = (float)((uint)bVar6 * auVar36._8_4_ | (uint)!bVar6 * (int)pfVar4[2]);
      pfVar4[3] = (float)((uint)bVar7 * auVar36._12_4_ | (uint)!bVar7 * (int)pfVar4[3]);
      pfVar4[4] = (float)((uint)bVar8 * auVar36._16_4_ | (uint)!bVar8 * (int)pfVar4[4]);
      pfVar4[5] = (float)((uint)bVar9 * auVar36._20_4_ | (uint)!bVar9 * (int)pfVar4[5]);
      pfVar4[6] = (float)((uint)bVar10 * auVar36._24_4_ | (uint)!bVar10 * (int)pfVar4[6]);
      pfVar4[7] = (float)((uint)bVar11 * auVar36._28_4_ | (uint)!bVar11 * (int)pfVar4[7]);
      pfVar4[8] = (float)((uint)(bVar23 & 1) * auVar36._32_4_ |
                         (uint)!(bool)(bVar23 & 1) * (int)pfVar4[8]);
      pfVar4[9] = (float)((uint)bVar12 * auVar36._36_4_ | (uint)!bVar12 * (int)pfVar4[9]);
      pfVar4[10] = (float)((uint)bVar13 * auVar36._40_4_ | (uint)!bVar13 * (int)pfVar4[10]);
      pfVar4[0xb] = (float)((uint)bVar14 * auVar36._44_4_ | (uint)!bVar14 * (int)pfVar4[0xb]);
      pfVar4[0xc] = (float)((uint)bVar15 * auVar36._48_4_ | (uint)!bVar15 * (int)pfVar4[0xc]);
      pfVar4[0xd] = (float)((uint)bVar16 * auVar36._52_4_ | (uint)!bVar16 * (int)pfVar4[0xd]);
      pfVar4[0xe] = (float)((uint)bVar17 * auVar36._56_4_ | (uint)!bVar17 * (int)pfVar4[0xe]);
      pfVar4[0xf] = (float)((uint)(bVar23 >> 7) * auVar36._60_4_ |
                           (uint)!(bool)(bVar23 >> 7) * (int)pfVar4[0xf]);
      lVar26 = lVar26 + 0x10;
    } while (((uVar24 & 0x3fffffffffffffff) + 0x10) - (ulong)((uint)uVar24 & 0xf) != lVar26);
  }
  pfVar4 = *ppfVar1;
  *pfVar4 = 0.0;
  if (1 < uVar28) {
    auVar19 = vcvtusi2ss_avx512f(auVar41,sVar25);
    sVar27 = 0;
    do {
      va = pfVar3[sVar27];
      vb = 0.0;
      if (va < 0.0) {
        LogFatal<char_const(&)[12],char_const(&)[2],char_const(&)[12],float&,char_const(&)[2],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling.h"
                   ,0x2a8,"Check failed: %s >= %s with %s = %s, %s = %s",
                   (char (*) [12])"func[i - 1]",(char (*) [2])0x2cbcd0a,(char (*) [12])"func[i - 1]"
                   ,(float *)&va,(char (*) [2])0x2cbcd0a,(int *)&vb);
      }
      pfVar4[sVar27 + 1] = ((local_3c - local_40) * pfVar3[sVar27]) / auVar19._0_4_ + pfVar4[sVar27]
      ;
      sVar27 = sVar27 + 1;
    } while (sVar25 != sVar27);
  }
  fVar2 = pfVar4[sVar25];
  this->funcInt = fVar2;
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    if (1 < uVar28) {
      sVar27 = 0;
      do {
        pfVar4[sVar27 + 1] = pfVar4[sVar27 + 1] / this->funcInt;
        sVar27 = sVar27 + 1;
      } while (sVar25 != sVar27);
    }
  }
  else if (1 < uVar28) {
    auVar41 = vcvtusi2ss_avx512f(auVar41,sVar25);
    auVar32 = vpbroadcastq_avx512f();
    auVar33 = vbroadcastss_avx512f(auVar41);
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0x100f0e0d0c0b0a09));
    auVar35 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    uVar28 = 0;
    auVar36 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar38 = vpbroadcastq_avx512f(ZEXT816(0x10));
    do {
      auVar39 = vpbroadcastq_avx512f();
      auVar40 = vporq_avx512f(auVar39,auVar36);
      auVar39 = vporq_avx512f(auVar39,auVar37);
      uVar20 = vpcmpuq_avx512f(auVar39,auVar32,2);
      uVar21 = vpcmpuq_avx512f(auVar40,auVar32,2);
      bVar22 = (byte)uVar21;
      uVar29 = CONCAT11(bVar22,(byte)uVar20);
      auVar30 = vcvtuqq2ps_avx512dq(auVar35);
      auVar31 = vcvtuqq2ps_avx512dq(auVar34);
      auVar39 = vinsertf64x4_avx512f(ZEXT3264(auVar30),auVar31,1);
      auVar39 = vdivps_avx512f(auVar39,auVar33);
      pfVar3 = pfVar4 + uVar28 + 1;
      bVar5 = (bool)((byte)uVar20 & 1);
      bVar6 = (bool)((byte)(uVar29 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar29 >> 2) & 1);
      bVar8 = (bool)((byte)(uVar29 >> 3) & 1);
      bVar9 = (bool)((byte)(uVar29 >> 4) & 1);
      bVar10 = (bool)((byte)(uVar29 >> 5) & 1);
      bVar11 = (bool)((byte)(uVar29 >> 6) & 1);
      bVar12 = (bool)((byte)(uVar29 >> 7) & 1);
      bVar13 = (bool)(bVar22 >> 1 & 1);
      bVar14 = (bool)(bVar22 >> 2 & 1);
      bVar15 = (bool)(bVar22 >> 3 & 1);
      bVar16 = (bool)(bVar22 >> 4 & 1);
      bVar17 = (bool)(bVar22 >> 5 & 1);
      bVar18 = (bool)(bVar22 >> 6 & 1);
      *pfVar3 = (float)((uint)bVar5 * auVar39._0_4_ | (uint)!bVar5 * (int)*pfVar3);
      pfVar3[1] = (float)((uint)bVar6 * auVar39._4_4_ | (uint)!bVar6 * (int)pfVar3[1]);
      pfVar3[2] = (float)((uint)bVar7 * auVar39._8_4_ | (uint)!bVar7 * (int)pfVar3[2]);
      pfVar3[3] = (float)((uint)bVar8 * auVar39._12_4_ | (uint)!bVar8 * (int)pfVar3[3]);
      pfVar3[4] = (float)((uint)bVar9 * auVar39._16_4_ | (uint)!bVar9 * (int)pfVar3[4]);
      pfVar3[5] = (float)((uint)bVar10 * auVar39._20_4_ | (uint)!bVar10 * (int)pfVar3[5]);
      pfVar3[6] = (float)((uint)bVar11 * auVar39._24_4_ | (uint)!bVar11 * (int)pfVar3[6]);
      pfVar3[7] = (float)((uint)bVar12 * auVar39._28_4_ | (uint)!bVar12 * (int)pfVar3[7]);
      pfVar3[8] = (float)((uint)(bVar22 & 1) * auVar39._32_4_ |
                         (uint)!(bool)(bVar22 & 1) * (int)pfVar3[8]);
      pfVar3[9] = (float)((uint)bVar13 * auVar39._36_4_ | (uint)!bVar13 * (int)pfVar3[9]);
      pfVar3[10] = (float)((uint)bVar14 * auVar39._40_4_ | (uint)!bVar14 * (int)pfVar3[10]);
      pfVar3[0xb] = (float)((uint)bVar15 * auVar39._44_4_ | (uint)!bVar15 * (int)pfVar3[0xb]);
      pfVar3[0xc] = (float)((uint)bVar16 * auVar39._48_4_ | (uint)!bVar16 * (int)pfVar3[0xc]);
      pfVar3[0xd] = (float)((uint)bVar17 * auVar39._52_4_ | (uint)!bVar17 * (int)pfVar3[0xd]);
      pfVar3[0xe] = (float)((uint)bVar18 * auVar39._56_4_ | (uint)!bVar18 * (int)pfVar3[0xe]);
      pfVar3[0xf] = (float)((uint)(bVar22 >> 7) * auVar39._60_4_ |
                           (uint)!(bool)(bVar22 >> 7) * (int)pfVar3[0xf]);
      uVar28 = uVar28 + 0x10;
      auVar35 = vpaddq_avx512f(auVar35,auVar38);
      auVar34 = vpaddq_avx512f(auVar34,auVar38);
    } while ((sVar25 + 0xf & 0xfffffffffffffff0) != uVar28);
  }
  return;
}

Assistant:

PiecewiseConstant1D(pstd::span<const Float> f, Float min, Float max,
                        Allocator alloc = {})
        : func(f.begin(), f.end(), alloc), cdf(f.size() + 1, alloc), min(min), max(max) {
        CHECK_GT(max, min);
        // Take absolute value of _func_
        for (Float &f : func)
            f = std::abs(f);

        // Compute integral of step function at $x_i$
        cdf[0] = 0;
        size_t n = f.size();
        for (size_t i = 1; i < n + 1; ++i) {
            CHECK_GE(func[i - 1], 0);
            cdf[i] = cdf[i - 1] + func[i - 1] * (max - min) / n;
        }

        // Transform step function integral into CDF
        funcInt = cdf[n];
        if (funcInt == 0)
            for (size_t i = 1; i < n + 1; ++i)
                cdf[i] = Float(i) / Float(n);
        else
            for (size_t i = 1; i < n + 1; ++i)
                cdf[i] /= funcInt;
    }